

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::PopulateCustomVectors(cmCTestCoverageHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  ostream *poVar3;
  string *ecg;
  pointer pbVar4;
  string *cce;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Add coverage exclude regular expressions.");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x29b,local_1c8[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_CUSTOM_COVERAGE_EXCLUDE",(allocator<char> *)local_1c8)
  ;
  cmCTest::PopulateCustomVector(pcVar1,mf,(string *)&cmCTestLog_msg,&this->CustomCoverageExclude);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_EXTRA_COVERAGE_GLOB",(allocator<char> *)local_1c8);
  cmCTest::PopulateCustomVector(pcVar1,mf,(string *)&cmCTestLog_msg,&this->ExtraCoverageGlobs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pbVar2 = (this->CustomCoverageExclude).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->CustomCoverageExclude).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Add coverage exclude: ");
    poVar3 = std::operator<<(poVar3,(string *)pbVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2a3,local_1c8[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  pbVar2 = (this->ExtraCoverageGlobs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->ExtraCoverageGlobs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg," Add coverage glob: ");
    poVar3 = std::operator<<(poVar3,(string *)pbVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2a8,local_1c8[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::PopulateCustomVectors(cmMakefile* mf)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " Add coverage exclude regular expressions." << std::endl,
                     this->Quiet);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_COVERAGE_EXCLUDE",
                                    this->CustomCoverageExclude);
  this->CTest->PopulateCustomVector(mf, "CTEST_EXTRA_COVERAGE_GLOB",
                                    this->ExtraCoverageGlobs);
  for (std::string const& cce : this->CustomCoverageExclude) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Add coverage exclude: " << cce << std::endl,
                       this->Quiet);
  }
  for (std::string const& ecg : this->ExtraCoverageGlobs) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Add coverage glob: " << ecg << std::endl,
                       this->Quiet);
  }
}